

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.h
# Opt level: O2

void __thiscall CConnman::ListenSocket::ListenSocket(ListenSocket *this,ListenSocket *param_1)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->sock).super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar2 = *(undefined4 *)
           &(param_1->sock).super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar3 = *(undefined4 *)
           ((long)&(param_1->sock).super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4);
  uVar4 = *(undefined4 *)
           &(param_1->sock).super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  uVar5 = *(undefined4 *)
           ((long)&(param_1->sock).super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi + 4);
  (param_1->sock).super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined4 *)&(this->sock).super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = uVar2;
  *(undefined4 *)
   ((long)&(this->sock).super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) = uVar3;
  *(undefined4 *)
   &(this->sock).super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = uVar4;
  *(undefined4 *)
   ((long)&(this->sock).super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 4)
       = uVar5;
  (param_1->sock).super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  this->m_permissions = param_1->m_permissions;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void AddSocketPermissionFlags(NetPermissionFlags& flags) const { NetPermissions::AddFlag(flags, m_permissions); }